

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Core.c
# Opt level: O2

int Llb_ManModelCheckAig
              (Aig_Man_t *pAigGlo,Gia_ParLlb_t *pPars,Vec_Int_t *vHints,DdManager **pddGlo)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *pAig;
  Llb_Man_t *p;
  abctime aVar3;
  int level;
  
  aVar2 = Abc_Clock();
  if (pPars->fIndConstr != 0) {
    if (vHints != (Vec_Int_t *)0x0) {
      __assert_fail("vHints == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Core.c"
                    ,0x79,
                    "int Llb_ManModelCheckAig(Aig_Man_t *, Gia_ParLlb_t *, Vec_Int_t *, DdManager **)"
                   );
    }
    vHints = Llb_ManDeriveConstraints(pAigGlo);
  }
  if (vHints == (Vec_Int_t *)0x0) {
    pAig = Aig_ManDupSimple(pAigGlo);
  }
  else {
    if (pPars->fVerbose != 0) {
      Llb_ManPrintEntries(pAigGlo,vHints);
    }
    pAig = Aig_ManDupSimpleWithHints(pAigGlo,vHints);
  }
  p = Llb_ManStart(pAigGlo,pAig,pPars);
  if (pPars->fVerbose != 0) {
    Llb_ManPrintAig(p);
    printf("Original matrix:          ");
    Llb_MtrPrintMatrixStats(p->pMatrix);
    if (pPars->fVeryVerbose != 0) {
      Llb_MtrPrint(p->pMatrix,1);
    }
  }
  if (pPars->fCluster != 0) {
    Llb_ManCluster(p->pMatrix);
    if (pPars->fVerbose != 0) {
      printf("Matrix after clustering:  ");
      Llb_MtrPrintMatrixStats(p->pMatrix);
      if (pPars->fVeryVerbose != 0) {
        Llb_MtrPrint(p->pMatrix,1);
      }
    }
  }
  if (pPars->fSchedule != 0) {
    Llb_MtrSchedule(p->pMatrix);
    if (pPars->fVerbose != 0) {
      printf("Matrix after scheduling:  ");
      Llb_MtrPrintMatrixStats(p->pMatrix);
      if (pPars->fVeryVerbose != 0) {
        Llb_MtrPrint(p->pMatrix,1);
      }
    }
  }
  if (p->pPars->fSkipReach == 0) {
    iVar1 = Llb_ManReachability(p,vHints,pddGlo);
  }
  else {
    iVar1 = -1;
  }
  Llb_ManStop(p);
  level = (int)p;
  aVar3 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  if ((vHints != (Vec_Int_t *)0x0) && (pPars->fIndConstr != 0)) {
    free(vHints->pArray);
    free(vHints);
  }
  return iVar1;
}

Assistant:

int Llb_ManModelCheckAig( Aig_Man_t * pAigGlo, Gia_ParLlb_t * pPars, Vec_Int_t * vHints, DdManager ** pddGlo )
{
    Llb_Man_t * p = NULL; 
    Aig_Man_t * pAig;
    int RetValue = -1;
    abctime clk = Abc_Clock();

    if ( pPars->fIndConstr )
    {
        assert( vHints == NULL );
        vHints = Llb_ManDeriveConstraints( pAigGlo );
    }

    // derive AIG for hints
    if ( vHints == NULL )
        pAig = Aig_ManDupSimple( pAigGlo );
    else
    {
        if ( pPars->fVerbose )
            Llb_ManPrintEntries( pAigGlo, vHints );
        pAig = Aig_ManDupSimpleWithHints( pAigGlo, vHints );
    }


    if ( pPars->fUseFlow )
    {
//        p = Llb_ManStartFlow( pAigGlo, pAig, pPars );
    }
    else
    {
        p = Llb_ManStart( pAigGlo, pAig, pPars );
        if ( pPars->fVerbose )
        {
            Llb_ManPrintAig( p );
            printf( "Original matrix:          " );
            Llb_MtrPrintMatrixStats( p->pMatrix );
            if ( pPars->fVeryVerbose )
                Llb_MtrPrint( p->pMatrix, 1 );
        }
        if ( pPars->fCluster )
        {
            Llb_ManCluster( p->pMatrix );
            if ( pPars->fVerbose )
            {
                printf( "Matrix after clustering:  " );
                Llb_MtrPrintMatrixStats( p->pMatrix );
                if ( pPars->fVeryVerbose )
                    Llb_MtrPrint( p->pMatrix, 1 );
            }
        }
        if ( pPars->fSchedule )
        {
            Llb_MtrSchedule( p->pMatrix );
            if ( pPars->fVerbose )
            {
                printf( "Matrix after scheduling:  " );
                Llb_MtrPrintMatrixStats( p->pMatrix );
                if ( pPars->fVeryVerbose )
                    Llb_MtrPrint( p->pMatrix, 1 );
            }
        }
    }
    
    if ( !p->pPars->fSkipReach ) 
        RetValue = Llb_ManReachability( p, vHints, pddGlo );
    Llb_ManStop( p );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( pPars->fIndConstr )
        Vec_IntFreeP( &vHints );
    return RetValue;
}